

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cc
# Opt level: O2

void __thiscall
tchecker::ite_expression_t::ite_expression_t
          (ite_expression_t *this,shared_ptr<const_tchecker::expression_t> *condition,
          shared_ptr<const_tchecker::expression_t> *then_value,
          shared_ptr<const_tchecker::expression_t> *else_value)

{
  invalid_argument *this_00;
  
  *(undefined ***)this = &PTR__ite_expression_t_001f4188;
  std::__shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_condition).
              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>,
             &condition->
              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_then_value).
              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>,
             &then_value->
              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_else_value).
              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>,
             &else_value->
              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>);
  if ((this->_condition).
      super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr ite_condition expression");
  }
  else if ((this->_then_value).
           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
           (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr then_value expression");
  }
  else {
    if ((this->_else_value).
        super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr else_value expression");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ite_expression_t::ite_expression_t(std::shared_ptr<tchecker::expression_t const> const & condition,
                                   std::shared_ptr<tchecker::expression_t const> const & then_value,
                                   std::shared_ptr<tchecker::expression_t const> const & else_value)
    : _condition(condition), _then_value(then_value), _else_value(else_value)
{
  if (_condition.get() == nullptr)
    throw std::invalid_argument("nullptr ite_condition expression");
  if (_then_value.get() == nullptr)
    throw std::invalid_argument("nullptr then_value expression");
  if (_else_value.get() == nullptr)
    throw std::invalid_argument("nullptr else_value expression");
}